

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall Hpipe::Vec<unsigned_int>::Vec(Vec<unsigned_int> *this,uint a)

{
  uint local_14;
  Vec<unsigned_int> *pVStack_10;
  uint a_local;
  Vec<unsigned_int> *this_local;
  
  local_14 = a;
  pVStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  push_back<unsigned_int&>(this,&local_14);
  return;
}

Assistant:

Vec( T a ) { push_back( a ); }